

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

bool __thiscall APlayerPawn::ResetAirSupply(APlayerPawn *this,bool playgasp)

{
  FSoundID local_18;
  byte local_12;
  undefined1 local_11;
  bool wasdrowning;
  APlayerPawn *pAStack_10;
  bool playgasp_local;
  APlayerPawn *this_local;
  
  local_12 = ((this->super_AActor).player)->air_finished < ::level.time;
  if ((playgasp) && ((bool)local_12)) {
    local_11 = playgasp;
    pAStack_10 = this;
    FSoundID::FSoundID(&local_18,"*gasp");
    S_Sound(&this->super_AActor,2,&local_18,1.0,1.0);
  }
  if ((::level.airsupply < 1) || (((this->super_AActor).player)->mo->AirCapacity <= 0.0)) {
    ((this->super_AActor).player)->air_finished = 0x7fffffff;
  }
  else {
    ((this->super_AActor).player)->air_finished =
         ::level.time +
         (int)((double)::level.airsupply * ((this->super_AActor).player)->mo->AirCapacity);
  }
  return (bool)(local_12 & 1);
}

Assistant:

bool APlayerPawn::ResetAirSupply (bool playgasp)
{
	bool wasdrowning = (player->air_finished < level.time);

	if (playgasp && wasdrowning)
	{
		S_Sound (this, CHAN_VOICE, "*gasp", 1, ATTN_NORM);
	}
	if (level.airsupply> 0 && player->mo->AirCapacity > 0) player->air_finished = level.time + int(level.airsupply * player->mo->AirCapacity);
	else player->air_finished = INT_MAX;
	return wasdrowning;
}